

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * boolToStr_abi_cxx11_(string *__return_storage_ptr__,bool *x)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "false";
  if (*x != false) {
    __s = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string boolToStr(const bool& x) { return x ? "true" : "false"; }